

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::ConcreteMachine
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this,Target *target,
          ROMFetcher *rom_fetcher)

{
  int iVar1;
  initializer_list<double> __l;
  value_type vVar2;
  bool bVar3;
  byte bVar4;
  pointer pTVar5;
  undefined4 *puVar6;
  pointer ppVar7;
  byte *pbVar8;
  reference pvVar9;
  MemorySlot *pMVar10;
  HandledSlot *pHVar11;
  ulong uVar12;
  uint8_t *local_348;
  key_type local_2fc;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_2f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *msx_music;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_2d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dos;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_2c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bios;
  _Self local_2b0;
  iterator regional_bios;
  undefined1 local_2a0 [7];
  bool has_bios;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request local_248;
  Request local_220;
  Request local_1f8;
  undefined1 local_1d0 [8];
  Request request;
  Request local_180;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [24];
  Name regional_bios_name;
  uint8_t keyboard;
  uint8_t date_format;
  uint8_t character_generator;
  bool is_ntsc;
  Request bios_request;
  Name bios_name;
  string machine_name;
  ScanTarget *local_c8;
  undefined1 auStack_c0 [40];
  size_type local_98;
  vector<double,_std::allocator<double>_> local_90;
  HalfCycles local_78;
  HandledSlot *local_70;
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_58;
  ROMFetcher *local_20;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this_local;
  
  local_20 = rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  MSX::Machine::Machine(&this->super_Machine);
  MachineTypes::TimedMachine::TimedMachine(&this->super_TimedMachine);
  MachineTypes::AudioProducer::AudioProducer(&this->super_AudioProducer);
  MachineTypes::ScanProducer::ScanProducer(&this->super_ScanProducer);
  MachineTypes::MediaTarget::MediaTarget(&this->super_MediaTarget);
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set(&local_58);
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,&local_58);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set(&local_58);
  MachineTypes::JoystickMachine::JoystickMachine(&this->super_JoystickMachine);
  Configurable::Device::Device(&this->super_Device);
  ClockingHint::Observer::Observer(&this->super_Observer);
  Activity::Source::Source(&this->super_Source);
  MemorySlotChangeHandler::MemorySlotChangeHandler(&this->super_MemorySlotChangeHandler);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00ca14a8;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00ca1570;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00ca15b8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00ca15d0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00ca1608;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00ca1620;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca1650;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00ca1690;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00ca16a8;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_00ca16c8;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00ca16e0;
  (this->super_MemorySlotChangeHandler)._vptr_MemorySlotChangeHandler = (_func_int **)&DAT_00ca16f8;
  CPU::Z80::
  Processor<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>,_false,_false>::
  Processor(&this->z80_,this);
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::JustInTimeActor<>
            (&this->vdp_);
  Intel::i8255::
  i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>::
  i8255(&this->i8255_,&this->i8255_port_handler_);
  Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(&this->tape_player_,0x6d3d32);
  this->tape_player_is_sleeping_ = false;
  this->allow_fast_tape_ = false;
  this->use_fast_tape_ = false;
  i8255PortHandler::i8255PortHandler
            (&this->i8255_port_handler_,this,&(this->speaker_).audio_toggle,&this->tape_player_);
  Speaker<true>::Speaker(&this->speaker_);
  AYPortHandler::AYPortHandler(&this->ay_port_handler_,&this->tape_player_);
  this->primary_slots_ = '\0';
  local_348 = this->ram_mapper_;
  do {
    *local_348 = '\0';
    local_348 = local_348 + 1;
  } while (local_348 != &this->field_0x2a01c);
  local_70 = this->memory_slots_;
  HandledSlot::PrimarySlot(local_70,&this->super_MemorySlotChangeHandler);
  local_70 = this->memory_slots_ + 1;
  HandledSlot::PrimarySlot(local_70,&this->super_MemorySlotChangeHandler);
  local_70 = this->memory_slots_ + 2;
  HandledSlot::PrimarySlot(local_70,&this->super_MemorySlotChangeHandler);
  local_70 = this->memory_slots_ + 3;
  HandledSlot::PrimarySlot(local_70,&this->super_MemorySlotChangeHandler);
  this->final_slot_ = (HandledSlot *)0x0;
  HalfCycles::HalfCycles(&this->time_since_ay_update_);
  this->selected_key_line_ = 0;
  std::__cxx11::string::string((string *)&this->input_text_);
  MSX::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_);
  this->pc_zero_accesses_ = 0;
  this->performed_unmapped_access_ = false;
  HalfCycles::HalfCycles(&local_78,0x369e99);
  Ricoh::RP5C01::RP5C01::RP5C01(&this->clock_,local_78);
  this->next_clock_register_ = 0;
  MachineTypes::TimedMachine::set_clock_rate(&this->super_TimedMachine,3579545.0);
  clear_all_keys(this);
  GI::AY38910::AY38910SampleSource<false>::set_port_handler
            (&(this->speaker_).ay.super_AY38910SampleSource<false>,
             &(this->ay_port_handler_).super_PortHandler);
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>,_false>
  ::set_input_rate(&(this->speaker_).speaker.
                    super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>,_false>
                   ,1789772.5);
  ClockingHint::Source::set_clocking_hint_observer
            (&(this->tape_player_).super_TapePlayer.super_Source,&this->super_Observer);
  auStack_c0._8_4_ = -1.0842022e-19;
  auStack_c0._12_4_ = 1.6999999;
  auStack_c0._16_4_ = 0;
  auStack_c0._20_4_ = 0x3fe00000;
  local_c8 = (ScanTarget *)0x3fe0000000000000;
  auStack_c0._0_4_ = 0xa0000000;
  auStack_c0._4_4_ = 1.4499999;
  auStack_c0._32_8_ = &local_c8;
  local_98 = 4;
  std::allocator<double>::allocator((allocator<double> *)(machine_name.field_2._M_local_buf + 0xf));
  __l._M_len = local_98;
  __l._M_array = (iterator)auStack_c0._32_8_;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_90,__l,(allocator<double> *)(machine_name.field_2._M_local_buf + 0xf));
  Outputs::Speaker::
  CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>::
  set_relative_volumes(&(this->speaker_).mixer,&local_90);
  std::vector<double,_std::allocator<double>_>::~vector(&local_90);
  std::allocator<double>::~allocator((allocator<double> *)(machine_name.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bios_name,"MSX",
             (allocator<char> *)
             ((long)&bios_request.node.children.
                     super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bios_request.node.children.
                     super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bios_request.node.children.
  super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x40;
  ROM::Request::Request((Request *)&regional_bios_name,MSXGenericBIOS,false);
  local_138[0x17] = 1;
  local_138[0x16] = 1;
  local_138[0x15] = 1;
  local_138[0x14] = '\x01';
  iVar1 = *(int *)((long)&rom_fetcher_local[5].super__Function_base._M_manager + 4);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      local_138._16_4_ = MSXAmericanBIOS;
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_148);
      pTVar5 = std::
               unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
               ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                             *)local_148);
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::set_tv_standard(pTVar5,NTSC);
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_148);
      local_138[0x17] = 1;
      local_138[0x16] = 1;
      local_138[0x15] = '\x01';
      goto LAB_007542bc;
    }
    if (iVar1 == 2) {
      local_138._16_4_ = MSXEuropeanBIOS;
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_158);
      pTVar5 = std::
               unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
               ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                             *)local_158);
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::set_tv_standard(pTVar5,PAL);
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_158);
      local_138[0x17] = 0;
      local_138[0x16] = 1;
      local_138[0x15] = '\x02';
      goto LAB_007542bc;
    }
  }
  local_138._16_4_ = MSXJapaneseBIOS;
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
            ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
             local_138);
  pTVar5 = std::
           unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
           ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                         *)local_138);
  TI::TMS::TMS9918<(TI::TMS::Personality)0>::set_tv_standard(pTVar5,NTSC);
  std::
  unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 *)local_138);
  local_138[0x17] = 1;
  local_138[0x16] = 0;
  local_138[0x15] = '\0';
LAB_007542bc:
  ROM::Request::Request
            ((Request *)
             &request.node.children.
              super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_138._16_4_,false);
  ROM::Request::operator||
            (&local_180,(Request *)&regional_bios_name,
             (Request *)
             &request.node.children.
              super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ROM::Request::operator=((Request *)&regional_bios_name,&local_180);
  ROM::Request::~Request(&local_180);
  ROM::Request::~Request
            ((Request *)
             &request.node.children.
              super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ROM::Request::Request((Request *)local_1d0,(Request *)&regional_bios_name);
  if ((rom_fetcher_local[4].super__Function_base._M_functor._M_pod_data[8] & 1U) != 0) {
    ROM::Request::Request(&local_220,MSXDOS,false);
    ROM::Request::operator&&(&local_1f8,(Request *)local_1d0,&local_220);
    ROM::Request::operator=((Request *)local_1d0,&local_1f8);
    ROM::Request::~Request(&local_1f8);
    ROM::Request::~Request(&local_220);
  }
  if ((rom_fetcher_local[4].super__Function_base._M_functor._M_pod_data[9] & 1U) != 0) {
    ROM::Request::Request
              ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,MSXMusic,false);
    ROM::Request::operator&&
              (&local_248,(Request *)local_1d0,
               (Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ROM::Request::operator=((Request *)local_1d0,&local_248);
    ROM::Request::~Request(&local_248);
    ROM::Request::~Request((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_2a0,local_20,(Request *)local_1d0);
  bVar3 = ROM::Request::validate((Request *)local_1d0,(Map *)local_2a0);
  if (bVar3) {
    regional_bios._M_node._7_1_ = 0;
    local_2b0._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)local_2a0,(key_type *)(local_138 + 0x10));
    bios = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           std::
           map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ::end((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)local_2a0);
    bVar3 = std::operator!=(&local_2b0,(_Self *)&bios);
    if (bVar3) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_2b0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&ppVar7->second,0x8000);
      pMVar10 = bios_slot(this);
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_2b0);
      MemorySlot::set_source(pMVar10,&ppVar7->second);
      regional_bios._M_node._7_1_ = 1;
    }
    if ((regional_bios._M_node._7_1_ & 1) == 0) {
      local_2c8._M_node =
           (_Base_ptr)
           std::
           map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)local_2a0,
                  (key_type *)
                  &bios_request.node.children.
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_2c8);
      local_2c0 = &ppVar7->second;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_2c0,0x8000);
      bVar4 = ~local_138[0x17] << 7 | local_138[0x15] << 4 | local_138[0x16];
      pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_2c0,0x2b);
      vVar2 = local_138[0x14];
      *pbVar8 = bVar4;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_2c0,0x2c);
      *pvVar9 = vVar2;
      pMVar10 = bios_slot(this);
      MemorySlot::set_source(pMVar10,local_2c0);
    }
    pMVar10 = bios_slot(this);
    MemorySlot::map<(MSX::MemorySlot::AccessType)0>(pMVar10,0,0,0x8000);
    pMVar10 = ram_slot(this);
    MemorySlot::resize_source(pMVar10,0x10000);
    pMVar10 = ram_slot(this);
    MemorySlot::map<(MSX::MemorySlot::AccessType)1>(pMVar10,0,0,0x10000);
    if ((rom_fetcher_local[4].super__Function_base._M_functor._M_pod_data[8] & 1U) != 0) {
      disk_slot(this);
      std::make_unique<MSX::DiskROM,MSX::MemorySlot&>((MemorySlot *)&dos);
      pHVar11 = disk_primary(this);
      std::unique_ptr<MSX::MemorySlotHandler,std::default_delete<MSX::MemorySlotHandler>>::operator=
                ((unique_ptr<MSX::MemorySlotHandler,std::default_delete<MSX::MemorySlotHandler>> *)
                 &pHVar11->handler,
                 (unique_ptr<MSX::DiskROM,_std::default_delete<MSX::DiskROM>_> *)&dos);
      std::unique_ptr<MSX::DiskROM,_std::default_delete<MSX::DiskROM>_>::~unique_ptr
                ((unique_ptr<MSX::DiskROM,_std::default_delete<MSX::DiskROM>_> *)&dos);
      msx_music._4_4_ = 0x44;
      local_2e0._M_node =
           (_Base_ptr)
           std::
           map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)local_2a0,(key_type *)((long)&msx_music + 4));
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_2e0);
      local_2d8 = &ppVar7->second;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_2d8,0x4000);
      pMVar10 = disk_slot(this);
      MemorySlot::set_source(pMVar10,local_2d8);
      pMVar10 = disk_slot(this);
      MemorySlot::map<(MSX::MemorySlot::AccessType)0>(pMVar10,0,0x4000,0x2000);
      pMVar10 = disk_slot(this);
      MemorySlot::map_handler(pMVar10,0x6000,0x2000);
    }
    if ((rom_fetcher_local[4].super__Function_base._M_functor._M_pod_data[9] & 1U) != 0) {
      local_2fc = MSXMusic;
      local_2f8._M_node =
           (_Base_ptr)
           std::
           map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)local_2a0,&local_2fc);
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_2f8);
      local_2f0 = &ppVar7->second;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_2f0,0x10000);
      pMVar10 = msx_music_slot(this);
      MemorySlot::set_source(pMVar10,local_2f0);
      pMVar10 = msx_music_slot(this);
      MemorySlot::map<(MSX::MemorySlot::AccessType)0>(pMVar10,0,0,0x10000);
    }
    insert_media(this,(Media *)&rom_fetcher_local->_M_invoker);
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      type_string(this,(string *)&rom_fetcher_local[4].super__Function_base._M_manager);
    }
    page_primary(this,'\0');
    std::
    map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~map((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)local_2a0);
    ROM::Request::~Request((Request *)local_1d0);
    ROM::Request::~Request((Request *)&regional_bios_name);
    std::__cxx11::string::~string((string *)&bios_name);
    return;
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0;
  __cxa_throw(puVar6,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(const Target &target, const ROMMachine::ROMFetcher &rom_fetcher):
			z80_(*this),
			i8255_(i8255_port_handler_),
			tape_player_(3579545 * 2),
			i8255_port_handler_(*this, speaker_.audio_toggle, tape_player_),
			ay_port_handler_(tape_player_),
			memory_slots_{{*this}, {*this}, {*this}, {*this}},
			clock_(ClockRate) {
			set_clock_rate(ClockRate);
			clear_all_keys();

			speaker_.ay.set_port_handler(&ay_port_handler_);
			speaker_.speaker.set_input_rate(3579545.0f / 2.0f);
			tape_player_.set_clocking_hint_observer(this);

			// Set the AY to 50% of available volume, the toggle to 10% and leave 40% for an SCC.
			// If there is an OPLL, give it equal volume to the AY and expect some clipping.
			if constexpr (has_opll) {
				speaker_.mixer.set_relative_volumes({0.5f, 0.1f, 0.4f, 0.5f});
			} else {
				speaker_.mixer.set_relative_volumes({0.5f, 0.1f, 0.4f});
			}

			// Install the proper TV standard and select an ideal BIOS name.
			const std::string machine_name = "MSX";
			constexpr ROM::Name bios_name = model == Target::Model::MSX1 ? ROM::Name::MSXGenericBIOS : ROM::Name::MSX2GenericBIOS;

			ROM::Request bios_request = ROM::Request(bios_name);
			if constexpr (model == Target::Model::MSX2) {
				bios_request = bios_request && ROM::Request(ROM::Name::MSX2Extension);
			}

			bool is_ntsc = true;
			uint8_t character_generator = 1;	/* 0 = Japan, 1 = USA, etc, 2 = USSR */
			uint8_t date_format = 1;			/* 0 = Y/M/D, 1 = M/D/Y, 2 = D/M/Y */
			uint8_t keyboard = 1;				/* 0 = Japan, 1 = USA, 2 = France, 3 = UK, 4 = Germany, 5 = USSR, 6 = Spain */
			[[maybe_unused]] ROM::Name regional_bios_name;

			switch(target.region) {
				default:
				case Target::Region::Japan:
					if constexpr (model == Target::Model::MSX1) {
						regional_bios_name = ROM::Name::MSXJapaneseBIOS;
					}
					vdp_->set_tv_standard(TI::TMS::TVStandard::NTSC);

					is_ntsc = true;
					character_generator = 0;
					date_format = 0;
				break;
				case Target::Region::USA:
					if constexpr (model == Target::Model::MSX1) {
						regional_bios_name = ROM::Name::MSXAmericanBIOS;
					}
					vdp_->set_tv_standard(TI::TMS::TVStandard::NTSC);

					is_ntsc = true;
					character_generator = 1;
					date_format = 1;
				break;
				case Target::Region::Europe:
					if constexpr (model == Target::Model::MSX1) {
						regional_bios_name = ROM::Name::MSXEuropeanBIOS;
					}
					vdp_->set_tv_standard(TI::TMS::TVStandard::PAL);

					is_ntsc = false;
					character_generator = 1;
					date_format = 2;
				break;
			}
			if constexpr (model == Target::Model::MSX1) {
				bios_request = bios_request || ROM::Request(regional_bios_name);
			}

			// Fetch the necessary ROMs; try the region-specific ROM first,
			// but failing that fall back on patching the main one.
			ROM::Request request = bios_request;
			if(target.has_disk_drive) {
				request = request && ROM::Request(ROM::Name::MSXDOS);
			}
			if(target.has_msx_music) {
				request = request && ROM::Request(ROM::Name::MSXMusic);
			}

			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// Figure out which BIOS to use, either a specific one or the generic
			// one appropriately patched.
			bool has_bios = false;
			if constexpr (model == Target::Model::MSX1) {
				const auto regional_bios = roms.find(regional_bios_name);
				if(regional_bios != roms.end()) {
					regional_bios->second.resize(32768);
					bios_slot().set_source(regional_bios->second);
					has_bios = true;
				}
			}
			if(!has_bios) {
				std::vector<uint8_t> &bios = roms.find(bios_name)->second;

				bios.resize(32768);

				// Modify the generic ROM to reflect the selected region, date format, etc.
				bios[0x2b] = uint8_t(
					(is_ntsc ? 0x00 : 0x80) |
					(date_format << 4) |
					character_generator
				);
				bios[0x2c] = keyboard;

				bios_slot().set_source(bios);
			}

			bios_slot().map(0, 0, 32768);

			ram_slot().resize_source(RAMSize);
			ram_slot().template map<MemorySlot::AccessType::ReadWrite>(0, 0, 65536);

			if constexpr (model == Target::Model::MSX2) {
				memory_slots_[3].supports_secondary_paging = true;

				const auto extension = roms.find(ROM::Name::MSX2Extension);
				extension->second.resize(32768);
				extension_rom_slot().set_source(extension->second);
				extension_rom_slot().map(0, 0, 32768);
			}

			// Add a disk cartridge if any disks were supplied.
			if(target.has_disk_drive) {
				disk_primary().handler = std::make_unique<DiskROM>(disk_slot());

				std::vector<uint8_t> &dos = roms.find(ROM::Name::MSXDOS)->second;
				dos.resize(16384);
				disk_slot().set_source(dos);

				disk_slot().map(0, 0x4000, 0x2000);
				disk_slot().map_handler(0x6000, 0x2000);
			}

			// Grab the MSX-MUSIC ROM if applicable.
			if(target.has_msx_music) {
				std::vector<uint8_t> &msx_music = roms.find(ROM::Name::MSXMusic)->second;
				msx_music.resize(65536);
				msx_music_slot().set_source(msx_music);
				msx_music_slot().map(0, 0, 0x10000);
			}

			// Insert the media.
			insert_media(target.media);

			// Type whatever has been requested.
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			// Establish default paging.
			page_primary(0);
		}